

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Memory>::RefPtr
          (RefPtr<wabt::interp::Memory> *this,Store *store,Ref ref)

{
  long lVar1;
  long lVar2;
  size_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  Module *pMVar6;
  bool bVar7;
  Index IVar8;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar9;
  Frame *pFVar10;
  size_t *psVar11;
  Frame *pFVar12;
  Ref local_20;
  
  bVar7 = Store::Is<wabt::interp::Memory>(store,ref);
  if (bVar7) {
    local_20.index = ref.index;
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar8;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (Memory *)
                 (puVar9->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  interp::RefPtr();
  if ((ulong)store >> 0x3a == 0) {
    lVar1 = *(long *)ref.index;
    if ((Store *)(*(long *)(ref.index + 0x10) - lVar1 >> 5) < store) {
      lVar2 = *(long *)(ref.index + 8);
      pFVar10 = __gnu_cxx::new_allocator<wabt::interp::Frame>::allocate
                          ((new_allocator<wabt::interp::Frame> *)ref.index,(size_type)store,
                           (void *)0x0);
      psVar3 = *(size_t **)(ref.index + 8);
      pFVar12 = pFVar10;
      for (psVar11 = *(size_t **)ref.index; psVar11 != psVar3; psVar11 = psVar11 + 4) {
        sVar4 = *psVar11;
        sVar5 = psVar11[1];
        pMVar6 = (Module *)psVar11[3];
        pFVar12->inst = (Instance *)psVar11[2];
        pFVar12->mod = pMVar6;
        (pFVar12->func).index = sVar4;
        pFVar12->values = (int)sVar5;
        pFVar12->offset = (int)(sVar5 >> 0x20);
        pFVar12 = pFVar12 + 1;
      }
      if (*(void **)ref.index != (void *)0x0) {
        operator_delete(*(void **)ref.index);
      }
      *(Frame **)ref.index = pFVar10;
      *(long *)(ref.index + 8) = (lVar2 - lVar1) + (long)pFVar10;
      *(Frame **)(ref.index + 0x10) = pFVar10 + (long)store;
    }
    return;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}